

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::split_program_name(string *commandline)

{
  bool bVar1;
  path_type pVar2;
  reference pvVar3;
  size_type sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  size_type end;
  value_type keyChar;
  bool embeddedQuote;
  size_type esp;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vals;
  size_type in_stack_fffffffffffffe38;
  char __c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  string *to;
  uint in_stack_fffffffffffffe70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_129;
  string local_101 [5];
  size_type local_60;
  value_type local_52;
  byte local_51;
  size_type local_30;
  undefined1 local_11;
  
  local_11 = 0;
  this = in_RDI;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffe40);
  trim((string *)0x215630);
  local_30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of(&in_stack_fffffffffffffe40->first,
                           (char)(in_stack_fffffffffffffe38 >> 0x38),0x215646);
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (size_type)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x21567b);
    pVar2 = check_path((char *)in_RSI);
    ::std::__cxx11::string::~string(&in_stack_fffffffffffffe40->first);
    if (pVar2 == file) goto LAB_00215a74;
    local_30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of(&in_stack_fffffffffffffe40->first,
                             (char)(in_stack_fffffffffffffe38 >> 0x38),0x2156bc);
  } while (local_30 != 0xffffffffffffffff);
  pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](&in_stack_fffffffffffffe40->first,in_stack_fffffffffffffe38);
  if (((*pvVar3 == '\"') ||
      (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator[](&in_stack_fffffffffffffe40->first,in_stack_fffffffffffffe38),
      *pvVar3 == '\'')) ||
     (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](&in_stack_fffffffffffffe40->first,in_stack_fffffffffffffe38),
     *pvVar3 == '`')) {
    local_51 = 0;
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](&in_stack_fffffffffffffe40->first,in_stack_fffffffffffffe38);
    local_52 = *pvVar3;
    local_60 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of(&in_stack_fffffffffffffe40->first,
                             (char)(in_stack_fffffffffffffe38 >> 0x38),0x21574f);
    while( true ) {
      in_stack_fffffffffffffe70 = in_stack_fffffffffffffe70 & 0xffffff;
      if (local_60 != 0xffffffffffffffff) {
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[](&in_stack_fffffffffffffe40->first,in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe70 = CONCAT13(*pvVar3 == '\\',(int3)in_stack_fffffffffffffe70);
      }
      __c = (char)(in_stack_fffffffffffffe38 >> 0x38);
      if ((char)(in_stack_fffffffffffffe70 >> 0x18) == '\0') break;
      local_60 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_first_of(&in_stack_fffffffffffffe40->first,__c,0x2157b5);
      local_51 = 1;
    }
    if (local_60 == 0xffffffffffffffff) {
      local_30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find_first_of(&in_stack_fffffffffffffe40->first,__c,0x215a47);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (size_type)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_fffffffffffffe90,in_RSI);
      ::std::__cxx11::string::~string(&in_stack_fffffffffffffe40->first);
      local_30 = local_60 + 1;
      if ((local_51 & 1) != 0) {
        ::std::__cxx11::string::string(&this->first,&in_RDI->first);
        to = local_101;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  (&this->first,(char *)in_RDI,
                   (allocator<char> *)CONCAT44(pVar2,in_stack_fffffffffffffe70));
        ::std::operator+(in_stack_fffffffffffffe48,(char)((ulong)in_stack_fffffffffffffe40 >> 0x38))
        ;
        in_stack_fffffffffffffe5c = (int)local_52;
        pbVar5 = &local_129;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  (pbVar5,CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                   (char)((ulong)in_stack_fffffffffffffe50 >> 0x38),
                   (allocator<char> *)in_stack_fffffffffffffe48);
        find_and_replace(&in_RDI->first,(string *)CONCAT44(pVar2,in_stack_fffffffffffffe70),to);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffe90,in_RSI);
        ::std::__cxx11::string::~string(&in_stack_fffffffffffffe40->first);
        ::std::__cxx11::string::~string(&in_stack_fffffffffffffe40->first);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_129);
        ::std::__cxx11::string::~string(&in_stack_fffffffffffffe40->first);
        ::std::__cxx11::string::~string(&in_stack_fffffffffffffe40->first);
        ::std::allocator<char>::~allocator((allocator<char> *)local_101);
        ::std::__cxx11::string::~string(&in_stack_fffffffffffffe40->first);
      }
    }
  }
  else {
    local_30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of(&in_stack_fffffffffffffe40->first,
                             (char)(in_stack_fffffffffffffe38 >> 0x38),0x215a65);
  }
LAB_00215a74:
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x215a7e);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (size_type)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe50 = &local_150;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe90,in_RSI);
    ::std::__cxx11::string::~string(&in_stack_fffffffffffffe40->first);
    rtrim(&this->first);
  }
  __n = local_30;
  sVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    (in_RSI);
  if (__n < sVar4 - 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (size_type)in_stack_fffffffffffffe50,__n);
  }
  else {
    ::std::__cxx11::string::string(in_stack_fffffffffffffe50);
  }
  pbVar5 = &in_RDI->second;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffe90,in_RSI);
  ::std::__cxx11::string::~string(pbVar5);
  ltrim(&this->first);
  return this;
}

Assistant:

CLI11_INLINE std::pair<std::string, std::string> split_program_name(std::string commandline) {
    // try to determine the programName
    std::pair<std::string, std::string> vals;
    trim(commandline);
    auto esp = commandline.find_first_of(' ', 1);
    while(detail::check_path(commandline.substr(0, esp).c_str()) != path_type::file) {
        esp = commandline.find_first_of(' ', esp + 1);
        if(esp == std::string::npos) {
            // if we have reached the end and haven't found a valid file just assume the first argument is the
            // program name
            if(commandline[0] == '"' || commandline[0] == '\'' || commandline[0] == '`') {
                bool embeddedQuote = false;
                auto keyChar = commandline[0];
                auto end = commandline.find_first_of(keyChar, 1);
                while((end != std::string::npos) && (commandline[end - 1] == '\\')) {  // deal with escaped quotes
                    end = commandline.find_first_of(keyChar, end + 1);
                    embeddedQuote = true;
                }
                if(end != std::string::npos) {
                    vals.first = commandline.substr(1, end - 1);
                    esp = end + 1;
                    if(embeddedQuote) {
                        vals.first = find_and_replace(vals.first, std::string("\\") + keyChar, std::string(1, keyChar));
                    }
                } else {
                    esp = commandline.find_first_of(' ', 1);
                }
            } else {
                esp = commandline.find_first_of(' ', 1);
            }

            break;
        }
    }
    if(vals.first.empty()) {
        vals.first = commandline.substr(0, esp);
        rtrim(vals.first);
    }

    // strip the program name
    vals.second = (esp < commandline.length() - 1) ? commandline.substr(esp + 1) : std::string{};
    ltrim(vals.second);
    return vals;
}